

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O1

int blake2b_init(blake2b_state *S,size_t outlen)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t uVar8;
  int iVar9;
  uchar *p;
  long lVar10;
  blake2b_param P;
  undefined4 local_58;
  uint auStack_54 [15];
  
  iVar9 = -1;
  if (S != (blake2b_state *)0x0) {
    if (outlen - 0x41 < 0xffffffffffffffc0) {
      if (S->last_node != '\0') {
        S->f[1] = 0xffffffffffffffff;
      }
      S->f[0] = 0xffffffffffffffff;
      iVar9 = -1;
    }
    else {
      local_58._0_1_ = (undefined1)outlen;
      local_58._1_2_ = 0x100;
      local_58._3_1_ = 1;
      auStack_54[0] = 0;
      auStack_54[1] = 0;
      auStack_54[2] = 0;
      auStack_54[3] = 0;
      auStack_54[4] = 0;
      auStack_54[5] = 0;
      auStack_54[6] = 0;
      auStack_54[7] = 0;
      auStack_54[8] = 0;
      auStack_54[9] = 0;
      auStack_54[10] = 0;
      auStack_54[0xb] = 0;
      auStack_54[0xc] = 0;
      auStack_54[0xd] = 0;
      auStack_54[0xe] = 0;
      lVar10 = 0;
      memset(S->t,0,0xb0);
      S->h[0] = 0x6a09e667f3bcc908;
      S->h[1] = 0xbb67ae8584caa73b;
      S->h[2] = 0x3c6ef372fe94f82b;
      S->h[3] = 0xa54ff53a5f1d36f1;
      S->h[4] = 0x510e527fade682d1;
      S->h[5] = 0x9b05688c2b3e6c1f;
      S->h[6] = 0x1f83d9abfb41bd6b;
      S->h[7] = 0x5be0cd19137e2179;
      do {
        uVar3 = auStack_54[lVar10 * 2];
        uVar4 = auStack_54[lVar10 * 2 + 1];
        uVar5 = auStack_54[lVar10 * 2 + 2];
        puVar1 = S->h + lVar10;
        uVar6 = *(uint *)((long)puVar1 + 4);
        uVar8 = puVar1[1];
        uVar7 = *(uint *)((long)puVar1 + 0xc);
        puVar2 = S->h + lVar10;
        *(uint *)puVar2 = (uint)*puVar1 ^ (&local_58)[lVar10 * 2];
        *(uint *)((long)puVar2 + 4) = uVar6 ^ uVar3;
        *(uint *)(puVar2 + 1) = (uint)uVar8 ^ uVar4;
        *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uVar5;
        lVar10 = lVar10 + 2;
      } while (lVar10 != 8);
      S->outlen = (uint)outlen;
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int blake2b_init(blake2b_state *S, size_t outlen) {
	blake2b_param P;

	if (S == NULL) {
		return -1;
	}

	if ((outlen == 0) || (outlen > BLAKE2B_OUTBYTES)) {
		blake2b_invalidate_state(S);
		return -1;
	}

	/* Setup Parameter Block for unkeyed BLAKE2 */
	P.digest_length = (uint8_t)outlen;
	P.key_length = 0;
	P.fanout = 1;
	P.depth = 1;
	P.leaf_length = 0;
	P.node_offset = 0;
	P.node_depth = 0;
	P.inner_length = 0;
	memset(P.reserved, 0, sizeof(P.reserved));
	memset(P.salt, 0, sizeof(P.salt));
	memset(P.personal, 0, sizeof(P.personal));

	return blake2b_init_param(S, &P);
}